

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBrOn
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,BrOn *curr)

{
  BasicHeapType BVar1;
  HeapType local_20;
  
  if (curr->op - BrOnCast < 2) {
    local_20 = wasm::Type::getHeapType(&curr->castType);
    BVar1 = HeapType::getTop(&local_20);
    if (((uint)(0x7c < BVar1) * 4 + 3 & BVar1) == 0) {
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,&curr->ref,(Type)((ulong)BVar1 | 2));
      return;
    }
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  if (curr->op < BrOnCast) {
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyReferenceType
              ((ConstraintCollector *)this,&curr->ref);
    return;
  }
  handle_unreachable("unexpected op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                     ,0x369);
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
      case BrOnNonNull:
        noteAnyReference(&curr->ref);
        return;
      case BrOnCast:
      case BrOnCastFail: {
        auto top = curr->castType.getHeapType().getTop();
        note(&curr->ref, Type(top, Nullable));
        return;
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }